

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::BayesianProbitRegressor::Clear(BayesianProbitRegressor *this)

{
  BayesianProbitRegressor_Gaussian *this_00;
  Arena *pAVar1;
  uint32_t cached_has_bits;
  BayesianProbitRegressor *this_local;
  
  google::protobuf::RepeatedPtrField<CoreML::Specification::BayesianProbitRegressor_FeatureWeight>::
  Clear(&this->features_);
  google::protobuf::internal::ArenaStringPtr::ClearToEmpty(&this->regressioninputfeaturename_);
  google::protobuf::internal::ArenaStringPtr::ClearToEmpty(&this->optimisminputfeaturename_);
  google::protobuf::internal::ArenaStringPtr::ClearToEmpty(&this->samplingscaleinputfeaturename_);
  google::protobuf::internal::ArenaStringPtr::ClearToEmpty
            (&this->samplingtruncationinputfeaturename_);
  google::protobuf::internal::ArenaStringPtr::ClearToEmpty(&this->meanoutputfeaturename_);
  google::protobuf::internal::ArenaStringPtr::ClearToEmpty(&this->varianceoutputfeaturename_);
  google::protobuf::internal::ArenaStringPtr::ClearToEmpty
            (&this->pessimisticprobabilityoutputfeaturename_);
  google::protobuf::internal::ArenaStringPtr::ClearToEmpty
            (&this->sampledprobabilityoutputfeaturename_);
  pAVar1 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  if (((pAVar1 == (Arena *)0x0) && (this->bias_ != (BayesianProbitRegressor_Gaussian *)0x0)) &&
     (this_00 = this->bias_, this_00 != (BayesianProbitRegressor_Gaussian *)0x0)) {
    BayesianProbitRegressor_Gaussian::~BayesianProbitRegressor_Gaussian(this_00);
    operator_delete(this_00,0x28);
  }
  this->bias_ = (BayesianProbitRegressor_Gaussian *)0x0;
  this->numberoffeatures_ = 0;
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void BayesianProbitRegressor::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.BayesianProbitRegressor)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  features_.Clear();
  regressioninputfeaturename_.ClearToEmpty();
  optimisminputfeaturename_.ClearToEmpty();
  samplingscaleinputfeaturename_.ClearToEmpty();
  samplingtruncationinputfeaturename_.ClearToEmpty();
  meanoutputfeaturename_.ClearToEmpty();
  varianceoutputfeaturename_.ClearToEmpty();
  pessimisticprobabilityoutputfeaturename_.ClearToEmpty();
  sampledprobabilityoutputfeaturename_.ClearToEmpty();
  if (GetArenaForAllocation() == nullptr && bias_ != nullptr) {
    delete bias_;
  }
  bias_ = nullptr;
  numberoffeatures_ = 0u;
  _internal_metadata_.Clear<std::string>();
}